

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O1

ValueType __thiscall
draco::PointAttribute::DeduplicateTypedValues<short>
          (PointAttribute *this,GeometryAttribute *in_att,AttributeValueIndex in_att_offset)

{
  ValueType VVar1;
  
  switch(in_att->num_components_) {
  case '\x01':
    VVar1 = DeduplicateFormattedValues<short,1>(this,in_att,in_att_offset);
    return VVar1;
  case '\x02':
    VVar1 = DeduplicateFormattedValues<short,2>(this,in_att,in_att_offset);
    return VVar1;
  case '\x03':
    VVar1 = DeduplicateFormattedValues<short,3>(this,in_att,in_att_offset);
    return VVar1;
  case '\x04':
    VVar1 = DeduplicateFormattedValues<short,4>(this,in_att,in_att_offset);
    return VVar1;
  default:
    return 0;
  }
}

Assistant:

uint8_t num_components() const { return num_components_; }